

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool __thiscall wasm::WATParser::anon_unknown_0::LexIntCtx::takeDigit(LexIntCtx *this)

{
  size_t *psVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  string_view sVar5;
  
  if ((this->super_LexCtx).input._M_len == (this->super_LexCtx).lexedSize) {
    return false;
  }
  sVar5 = LexCtx::next(&this->super_LexCtx);
  bVar3 = *sVar5._M_str;
  if ((byte)(bVar3 - 0x3a) < 0xf6) {
    bVar4 = false;
  }
  else {
    psVar1 = &(this->super_LexCtx).lexedSize;
    *psVar1 = *psVar1 + 1;
    uVar2 = (ulong)(bVar3 & 0xf) + this->n * 10;
    if (uVar2 < this->n) {
      this->overflow = true;
    }
    this->n = uVar2;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool takeDigit() {
    if (!empty()) {
      if (auto d = getDigit(peek())) {
        take(1);
        uint64_t newN = n * 10 + *d;
        if (newN < n) {
          overflow = true;
        }
        n = newN;
        return true;
      }
    }
    return false;
  }